

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_publish(Curl_easy *data)

{
  char *__s;
  bool bVar1;
  CURLcode CVar2;
  size_t __n;
  ulong uVar3;
  char *buf;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t __n_00;
  size_t topiclen;
  char *topic;
  char encodedbytes [4];
  char local_48;
  char cStack_47;
  undefined6 uStack_46;
  char *local_40;
  byte local_34 [4];
  
  __s = (char *)(data->set).postfields;
  local_40 = (char *)0x0;
  if (__s == (char *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  __n = (data->set).postfieldsize;
  if ((long)__n < 0) {
    __n = strlen(__s);
  }
  CVar2 = mqtt_get_topic(data,&local_40,(size_t *)&local_48);
  if (CVar2 == CURLE_OK) {
    __n_00 = 0;
    uVar3 = CONCAT62(uStack_46,CONCAT11(cStack_47,local_48)) + __n + 2;
    uVar4 = uVar3;
    uVar6 = __n_00;
    if (uVar3 != 0) {
      do {
        local_34[uVar6] = (0x7f < uVar4) << 7 | (byte)uVar4 & 0x7f;
        __n_00 = uVar6 + 1;
        if (2 < uVar6) break;
        bVar1 = 0x7f < uVar4;
        uVar4 = uVar4 >> 7;
        uVar6 = __n_00;
      } while (bVar1);
    }
    buf = (char *)(*Curl_cmalloc)(uVar3 + __n_00 + 1);
    if (buf != (char *)0x0) {
      *buf = '0';
      memcpy(buf + 1,local_34,__n_00);
      buf[__n_00 + 1] = cStack_47;
      buf[__n_00 + 2] = local_48;
      memcpy(buf + __n_00 + 3,local_40,CONCAT62(uStack_46,CONCAT11(cStack_47,local_48)));
      lVar5 = __n_00 + 3 + CONCAT62(uStack_46,CONCAT11(cStack_47,local_48));
      memcpy(buf + lVar5,__s,__n);
      CVar2 = mqtt_send(data,buf,lVar5 + __n);
      goto LAB_0014406e;
    }
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  buf = (char *)0x0;
LAB_0014406e:
  (*Curl_cfree)(buf);
  (*Curl_cfree)(local_40);
  return CVar2;
}

Assistant:

static CURLcode mqtt_publish(struct Curl_easy *data)
{
  CURLcode result;
  char *payload = data->set.postfields;
  size_t payloadlen;
  char *topic = NULL;
  size_t topiclen;
  unsigned char *pkt = NULL;
  size_t i = 0;
  size_t remaininglength;
  size_t encodelen;
  char encodedbytes[4];
  curl_off_t postfieldsize = data->set.postfieldsize;

  if(!payload) {
    DEBUGF(infof(data, "mqtt_publish without payload, return bad arg"));
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if(postfieldsize < 0)
    payloadlen = strlen(payload);
  else
    payloadlen = (size_t)postfieldsize;

  result = mqtt_get_topic(data, &topic, &topiclen);
  if(result)
    goto fail;

  remaininglength = payloadlen + 2 + topiclen;
  encodelen = mqtt_encode_len(encodedbytes, remaininglength);

  /* add the control byte and the encoded remaining length */
  pkt = malloc(remaininglength + 1 + encodelen);
  if(!pkt) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  /* assemble packet */
  pkt[i++] = MQTT_MSG_PUBLISH;
  memcpy(&pkt[i], encodedbytes, encodelen);
  i += encodelen;
  pkt[i++] = (topiclen >> 8) & 0xff;
  pkt[i++] = (topiclen & 0xff);
  memcpy(&pkt[i], topic, topiclen);
  i += topiclen;
  memcpy(&pkt[i], payload, payloadlen);
  i += payloadlen;
  result = mqtt_send(data, (char *)pkt, i);

fail:
  free(pkt);
  free(topic);
  return result;
}